

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::torrent_update_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,torrent_update_alert *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  difference_type in_RCX;
  span<const_char> in;
  span<const_char> in_00;
  string local_178;
  aux *local_148;
  char *local_140;
  string local_138;
  aux *local_118;
  char *local_110;
  string local_108;
  char local_e8 [8];
  char msg [200];
  torrent_update_alert *this_local;
  
  span<char_const>::span<libtorrent::digest32<160l>,char,void>
            ((span<char_const> *)&local_118,&this->old_ih);
  in.m_len = in_RCX;
  in.m_ptr = local_110;
  libtorrent::aux::to_hex_abi_cxx11_(&local_108,local_118,in);
  uVar1 = std::__cxx11::string::c_str();
  span<char_const>::span<libtorrent::digest32<160l>,char,void>
            ((span<char_const> *)&local_148,&this->new_ih);
  in_00.m_len = in_RCX;
  in_00.m_ptr = local_140;
  libtorrent::aux::to_hex_abi_cxx11_(&local_138,local_148,in_00);
  uVar2 = std::__cxx11::string::c_str();
  snprintf(local_e8,200," torrent changed info-hash from: %s to %s",uVar1,uVar2);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_108);
  torrent_alert::message_abi_cxx11_(&local_178,&this->super_torrent_alert);
  std::operator+(__return_storage_ptr__,&local_178,local_e8);
  std::__cxx11::string::~string((string *)&local_178);
  return __return_storage_ptr__;
}

Assistant:

std::string torrent_update_alert::message() const
	{
		char msg[200];
		std::snprintf(msg, sizeof(msg), " torrent changed info-hash from: %s to %s"
			, aux::to_hex(old_ih).c_str()
			, aux::to_hex(new_ih).c_str());
		return torrent_alert::message() + msg;
	}